

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_reconstructSolutionRational
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SolRational *sol,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *basisStatusRows,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *basisStatusCols,Rational *denomBoundSquared)

{
  bool bVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  Verbosity VVar5;
  int iVar6;
  VarStatus *pVVar7;
  RangeType *pRVar8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_RCX;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_10;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  int sig_1;
  int c_1;
  Verbosity old_verbosity_7;
  Verbosity old_verbosity_6;
  int sig;
  int r_1;
  bool maximizing;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  VarStatus *basisStatusRow;
  int r;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  VarStatus *basisStatusCol;
  int c;
  Verbosity old_verbosity;
  int j;
  DIdxSet basicIndices;
  bool isSolBasic;
  bool success;
  undefined4 in_stack_fffffffffffff938;
  fmtflags in_stack_fffffffffffff93c;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff940;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffff948;
  SPxOut *pSVar9;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff958;
  int in_stack_fffffffffffff95c;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffff960;
  Rational *in_stack_fffffffffffff9d0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff9d8;
  Verbosity local_468;
  Verbosity local_464 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  Verbosity local_3f8;
  Verbosity local_3f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  int local_390;
  int local_38c [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340 [16];
  undefined8 in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  Verbosity in_stack_fffffffffffffce0;
  Verbosity in_stack_fffffffffffffce4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  int local_2b4;
  int local_2b0;
  byte local_2a9;
  Verbosity local_2a8;
  Verbosity local_2a4 [25];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  Verbosity local_220;
  Verbosity local_21c [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined4 local_1a4;
  VarStatus *local_1a0;
  int local_194 [25];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Verbosity local_110;
  Verbosity local_10c [23];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined4 local_8c;
  VarStatus *local_88;
  int local_7c [3];
  int local_70;
  undefined4 local_5c;
  byte local_32;
  byte local_31;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_28;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x7c7984);
  DIdxSet::DIdxSet((DIdxSet *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c);
  local_31 = 0;
  local_32 = 1;
  bVar1 = SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::isPrimalFeasible(local_18);
  if ((bVar1) &&
     (bVar1 = SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::isDualFeasible(local_18), bVar1)) {
    (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[3])();
    in_RDI->_statistics->rationalReconstructions = in_RDI->_statistics->rationalReconstructions + 1;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)in_stack_fffffffffffff940,
                (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    for (local_70 = 0; iVar6 = local_70,
        iVar4 = numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x7c7a58), iVar6 < iVar4; local_70 = local_70 + 1) {
      pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](local_28,local_70);
      if (*pVVar7 == BASIC) {
        DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      }
    }
    local_31 = reconstructVector((VectorRational *)
                                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                 (Rational *)in_stack_fffffffffffffcd8,
                                 (DIdxSet *)in_stack_fffffffffffffcd0);
    if ((bool)local_31) {
      SPxOut::
      debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[56],_0>
                (in_RDI,(char (*) [56])"Rational reconstruction of primal solution successful.\n");
      local_7c[0] = numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x7c7c21);
      do {
        do {
          local_7c[0] = local_7c[0] + -1;
          if (local_7c[0] < 0) {
            numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x7c83ef);
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::reDim(in_stack_fffffffffffff9d8,(int)((ulong)in_stack_fffffffffffff9d0 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffff9d0 >> 0x18,0));
            (*(in_RDI->_rationalLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x46])
                      (in_RDI->_rationalLP,&in_RDI->_workSol,&(in_RDI->_workSol)._slacks,1);
            local_194[0] = numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)0x7c8453);
            goto LAB_007c846d;
          }
          local_88 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](&in_RDI->_basisStatusCols,local_7c[0]);
          if (*local_88 == FIXED) {
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
            lowerRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
            bVar2 = boost::multiprecision::operator!=
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                               (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)0x7c7ccf);
            bVar1 = true;
            if (!bVar2) goto LAB_007c7cf3;
          }
          else {
LAB_007c7cf3:
            if (*local_88 == ON_LOWER) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
              lowerRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
              bVar2 = boost::multiprecision::operator!=
                                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)0x7c7d56);
              bVar1 = true;
              if (bVar2) goto LAB_007c7e75;
            }
            if (*local_88 == ON_UPPER) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
              upperRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
              bVar2 = boost::multiprecision::operator!=
                                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)0x7c7ddd);
              bVar1 = true;
              if (bVar2) goto LAB_007c7e75;
            }
            if (*local_88 == ZERO) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
              local_8c = 0;
              tVar3 = boost::multiprecision::operator!=
                                (in_stack_fffffffffffff948,(int *)in_stack_fffffffffffff940);
              bVar1 = true;
              if (tVar3) goto LAB_007c7e75;
            }
            bVar1 = *local_88 == UNDEFINED;
          }
LAB_007c7e75:
          if (bVar1) {
            local_32 = 0;
          }
          pRVar8 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
                   ::operator[](&in_RDI->_colTypes,local_7c[0]);
          bVar1 = _lowerFinite(in_RDI,pRVar8);
          if (bVar1) {
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
            lowerRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
            tVar3 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                               (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)0x7c7f14);
            if (tVar3) {
              lowerRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
              boost::multiprecision::operator-
                        (in_stack_fffffffffffff948,
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)in_stack_fffffffffffff940);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              ::
              number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                        (in_stack_fffffffffffff960,
                         (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                          *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                         in_stack_fffffffffffff950);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                               in_stack_fffffffffffff93c);
              SPxOut::
              debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[43],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (in_RDI,(char (*) [43])"Lower bound of variable {} violated by {}\n",
                         local_7c,&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x7c7ff6);
              if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0xfffffffffffffff8) &&
                 (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
                local_10c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
                local_110 = INFO1;
                SPxOut::setVerbosity(&in_RDI->spxout,&local_110);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                                   (char *)CONCAT44(in_stack_fffffffffffff93c,
                                                    in_stack_fffffffffffff938));
                SPxOut::setVerbosity(&in_RDI->spxout,local_10c);
              }
              (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
              local_1 = 0;
              goto LAB_007c9f39;
            }
          }
          pRVar8 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
                   ::operator[](&in_RDI->_colTypes,local_7c[0]);
          bVar1 = _upperFinite(in_RDI,pRVar8);
        } while (!bVar1);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        upperRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x7c81a5);
      } while (!tVar3);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      upperRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      boost::multiprecision::operator-
                (in_stack_fffffffffffff948,
                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_fffffffffffff940);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::
      number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                (in_stack_fffffffffffff960,
                 (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                 in_stack_fffffffffffff950);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                       in_stack_fffffffffffff93c);
      SPxOut::
      debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[43],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (in_RDI,(char (*) [43])"Upper bound of variable {} violated by {}\n",local_7c,
                 &local_130);
      std::__cxx11::string::~string((string *)&local_130);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x7c8294);
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
        local_194[2] = SPxOut::getVerbosity(&in_RDI->spxout);
        local_194[1] = 3;
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_194 + 1));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                           (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_194 + 2));
      }
      (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
      local_1 = 0;
    }
    else {
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
        local_7c[2] = SPxOut::getVerbosity(&in_RDI->spxout);
        local_7c[1] = 3;
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_7c + 1));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                           (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_7c + 2));
      }
      (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
      local_1 = local_31 & 1;
    }
  }
  else {
    local_1 = local_31 & 1;
  }
  goto LAB_007c9f39;
  while( true ) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
    rhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)0x7c89d7);
    if (tVar3) break;
LAB_007c846d:
    do {
      local_194[0] = local_194[0] + -1;
      if (local_194[0] < 0) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_stack_fffffffffffff940,
                    (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
        local_31 = reconstructVector((VectorRational *)
                                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                     (Rational *)in_stack_fffffffffffffcd8,
                                     (DIdxSet *)in_stack_fffffffffffffcd0);
        if ((bool)local_31) {
          SPxOut::
          debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[52],_0>
                    (in_RDI,(char (*) [52])"Rational reconstruction of dual vector successful.\n");
          iVar6 = intParam(in_RDI,OBJSENSE);
          local_2a9 = iVar6 == 1;
          local_2b0 = numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)0x7c8d87);
          goto LAB_007c8da1;
        }
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
          local_2a4[0] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_2a8 = INFO1;
          SPxOut::setVerbosity(&in_RDI->spxout,&local_2a8);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                             (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
          SPxOut::setVerbosity(&in_RDI->spxout,local_2a4);
        }
        (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
        local_1 = local_31 & 1;
        goto LAB_007c9f39;
      }
      local_1a0 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  ::operator[](&in_RDI->_basisStatusRows,local_194[0]);
      if (*local_1a0 == FIXED) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        lhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x7c8501);
        bVar1 = true;
        if (!bVar2) goto LAB_007c8525;
      }
      else {
LAB_007c8525:
        if (*local_1a0 == ON_LOWER) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
          lhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
          bVar2 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)0x7c8588);
          bVar1 = true;
          if (bVar2) goto LAB_007c86a7;
        }
        if (*local_1a0 == ON_UPPER) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
          rhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
          bVar2 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)0x7c860f);
          bVar1 = true;
          if (bVar2) goto LAB_007c86a7;
        }
        if (*local_1a0 == ZERO) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
          local_1a4 = 0;
          tVar3 = boost::multiprecision::operator!=
                            (in_stack_fffffffffffff948,(int *)in_stack_fffffffffffff940);
          bVar1 = true;
          if (tVar3) goto LAB_007c86a7;
        }
        bVar1 = *local_1a0 == UNDEFINED;
      }
LAB_007c86a7:
      if (bVar1) {
        local_32 = 0;
      }
      pRVar8 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
               ::operator[](&in_RDI->_rowTypes,local_194[0]);
      bVar1 = _lowerFinite(in_RDI,pRVar8);
      if (bVar1) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        lhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x7c8746);
        if (tVar3) {
          lhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
          boost::multiprecision::operator-
                    (in_stack_fffffffffffff948,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffff940);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    (in_stack_fffffffffffff960,
                     (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                     in_stack_fffffffffffff950);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                           in_stack_fffffffffffff93c);
          SPxOut::
          debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[30],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (in_RDI,(char (*) [30])"Lhs of row {} violated by {}\n",local_194,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x7c8828);
          if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0xfffffffffffffff8) &&
             (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
            local_21c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
            local_220 = INFO1;
            SPxOut::setVerbosity(&in_RDI->spxout,&local_220);
            soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                               (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938)
                              );
            SPxOut::setVerbosity(&in_RDI->spxout,local_21c);
          }
          (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
          local_1 = 0;
          goto LAB_007c9f39;
        }
      }
      pRVar8 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
               ::operator[](&in_RDI->_rowTypes,local_194[0]);
      bVar1 = _upperFinite(in_RDI,pRVar8);
    } while (!bVar1);
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
  rhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
  boost::multiprecision::operator-
            (in_stack_fffffffffffff948,
             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              *)in_stack_fffffffffffff940);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
  ::
  number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
            (in_stack_fffffffffffff960,
             (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
  ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                   in_stack_fffffffffffff93c);
  SPxOut::
  debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[30],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (in_RDI,(char (*) [30])"Rhs of row {} violated by {}\n",local_194,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x7c8ac6);
  if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0xfffffffffffffff8) &&
     (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
    local_2a4[2] = SPxOut::getVerbosity(&in_RDI->spxout);
    local_2a4[1] = 3;
    SPxOut::setVerbosity(&in_RDI->spxout,local_2a4 + 1);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                       (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    SPxOut::setVerbosity(&in_RDI->spxout,local_2a4 + 2);
  }
  (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
  local_1 = 0;
  goto LAB_007c9f39;
LAB_007c8da1:
  local_2b0 = local_2b0 + -1;
  if (-1 < local_2b0) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
    local_2b4 = boost::multiprecision::
                sign<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    if ((((local_2a9 & 1) == 0) && (0 < local_2b4)) || (((local_2a9 & 1) != 0 && (local_2b4 < 0))))
    {
      pRVar8 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
               ::operator[](&in_RDI->_rowTypes,local_2b0);
      bVar1 = _lowerFinite(in_RDI,pRVar8);
      if (!bVar1) {
LAB_007c8eb9:
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                         in_stack_fffffffffffff93c);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                         in_stack_fffffffffffff93c);
        lhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                         in_stack_fffffffffffff93c);
        SPxOut::
        debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[84],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (in_RDI,(char (*) [84])
                          "complementary slackness violated by row {} with dual {} and slack {} not at lhs {}\n"
                   ,&local_2b0,&local_2d8,&local_2f8,&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2d8);
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
          pSVar9 = &in_RDI->spxout;
          SPxOut::getVerbosity(pSVar9);
          SPxOut::setVerbosity(pSVar9,(Verbosity *)&stack0xfffffffffffffce0);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                             (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
          SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xfffffffffffffce4);
        }
        (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
        local_1 = 0;
        goto LAB_007c9f39;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      lhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)0x7c8ea0);
      if (tVar3) goto LAB_007c8eb9;
      pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](&in_RDI->_basisStatusRows,local_2b0);
      if ((*pVVar7 != ON_LOWER) &&
         (pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](&in_RDI->_basisStatusRows,local_2b0), *pVVar7 != FIXED)) {
        pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](&in_RDI->_basisStatusRows,local_2b0);
        if ((*pVVar7 == BASIC) ||
           (pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](&in_RDI->_basisStatusRows,local_2b0), *pVVar7 == UNDEFINED)) {
          local_32 = 0;
        }
        else {
          pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](&in_RDI->_basisStatusRows,local_2b0);
          *pVVar7 = ON_LOWER;
        }
      }
    }
    else if ((((local_2a9 & 1) == 0) && (local_2b4 < 0)) ||
            (((local_2a9 & 1) != 0 && (0 < local_2b4)))) {
      pRVar8 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
               ::operator[](&in_RDI->_rowTypes,local_2b0);
      bVar1 = _upperFinite(in_RDI,pRVar8);
      if (bVar1) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        in_stack_fffffffffffff9d0 = rhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c)
        ;
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x7c9266);
        if (!tVar3) {
          pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](&in_RDI->_basisStatusRows,local_2b0);
          if ((*pVVar7 != ON_UPPER) &&
             (pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                       ::operator[](&in_RDI->_basisStatusRows,local_2b0), *pVVar7 != FIXED)) {
            pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](&in_RDI->_basisStatusRows,local_2b0);
            if ((*pVVar7 == BASIC) ||
               (pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                         ::operator[](&in_RDI->_basisStatusRows,local_2b0), *pVVar7 == UNDEFINED)) {
              local_32 = 0;
            }
            else {
              pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                       ::operator[](&in_RDI->_basisStatusRows,local_2b0);
              *pVVar7 = ON_UPPER;
            }
          }
          goto LAB_007c8da1;
        }
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                       in_stack_fffffffffffff93c);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                       in_stack_fffffffffffff93c);
      rhsRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                       in_stack_fffffffffffff93c);
      SPxOut::
      debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[84],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (in_RDI,(char (*) [84])
                        "complementary slackness violated by row {} with dual {} and slack {} not at rhs {}\n"
                 ,&local_2b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                 &local_360,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string(local_340);
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
        local_38c[2] = SPxOut::getVerbosity(&in_RDI->spxout);
        local_38c[1] = 3;
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_38c + 1));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                           (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_38c + 2));
      }
      (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
      local_1 = 0;
      goto LAB_007c9f39;
    }
    goto LAB_007c8da1;
  }
  numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x7c959e);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(in_stack_fffffffffffff9d8,(int)((ulong)in_stack_fffffffffffff9d0 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff9d0 >> 0x18,0));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::getObj(in_stack_fffffffffffff950,
           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            *)in_stack_fffffffffffff948);
  (*(in_RDI->_rationalLP->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[0x4a])
            (in_RDI->_rationalLP,&(in_RDI->_workSol)._dual,&(in_RDI->_workSol)._redCost);
  local_38c[0] = numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)0x7c9611);
LAB_007c9625:
  local_38c[0] = local_38c[0] + -1;
  if (-1 < local_38c[0]) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
    local_390 = boost::multiprecision::
                sign<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    if ((((local_2a9 & 1) == 0) && (0 < local_390)) || (((local_2a9 & 1) != 0 && (local_390 < 0))))
    {
      pRVar8 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
               ::operator[](&in_RDI->_colTypes,local_38c[0]);
      bVar1 = _lowerFinite(in_RDI,pRVar8);
      if (!bVar1) {
LAB_007c9725:
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                         in_stack_fffffffffffff93c);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                         in_stack_fffffffffffff93c);
        lowerRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                         in_stack_fffffffffffff93c);
        SPxOut::
        debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[103],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (in_RDI,(char (*) [103])
                          "complementary slackness violated by column {} with reduced cost {} and value {} not at lower bound {}\n"
                   ,local_38c,&local_3b0,&local_3d0,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3b0);
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
          local_3f4 = SPxOut::getVerbosity(&in_RDI->spxout);
          local_3f8 = INFO1;
          SPxOut::setVerbosity(&in_RDI->spxout,&local_3f8);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                             (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
          SPxOut::setVerbosity(&in_RDI->spxout,&local_3f4);
        }
        (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
        local_1 = 0;
        goto LAB_007c9f39;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      lowerRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)0x7c9712);
      if (tVar3) goto LAB_007c9725;
      pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](&in_RDI->_basisStatusCols,local_38c[0]);
      if ((*pVVar7 != ON_LOWER) &&
         (pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](&in_RDI->_basisStatusCols,local_38c[0]), *pVVar7 != FIXED)) {
        pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](&in_RDI->_basisStatusCols,local_38c[0]);
        if ((*pVVar7 == BASIC) ||
           (pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](&in_RDI->_basisStatusCols,local_38c[0]), *pVVar7 == UNDEFINED)) {
          local_32 = 0;
        }
        else {
          pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](&in_RDI->_basisStatusCols,local_38c[0]);
          *pVVar7 = ON_LOWER;
        }
      }
    }
    else if ((((local_2a9 & 1) == 0) && (local_390 < 0)) ||
            (((local_2a9 & 1) != 0 && (0 < local_390)))) {
      pRVar8 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
               ::operator[](&in_RDI->_colTypes,local_38c[0]);
      bVar1 = _upperFinite(in_RDI,pRVar8);
      if (bVar1) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        upperRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x7c9ab7);
        if (!tVar3) {
          pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](&in_RDI->_basisStatusCols,local_38c[0]);
          if ((*pVVar7 != ON_UPPER) &&
             (pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                       ::operator[](&in_RDI->_basisStatusCols,local_38c[0]), *pVVar7 != FIXED)) {
            pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](&in_RDI->_basisStatusCols,local_38c[0]);
            if ((*pVVar7 == BASIC) ||
               (pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                         ::operator[](&in_RDI->_basisStatusCols,local_38c[0]), *pVVar7 == UNDEFINED)
               ) {
              local_32 = 0;
            }
            else {
              pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                       ::operator[](&in_RDI->_basisStatusCols,local_38c[0]);
              *pVVar7 = ON_UPPER;
            }
          }
          goto LAB_007c9625;
        }
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                       in_stack_fffffffffffff93c);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                       in_stack_fffffffffffff93c);
      upperRational(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_(in_stack_fffffffffffff948,(streamsize)in_stack_fffffffffffff940,
                       in_stack_fffffffffffff93c);
      SPxOut::
      debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[103],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (in_RDI,(char (*) [103])
                        "complementary slackness violated by column {} with reduced cost {} and value {} not at upper bound {}\n"
                 ,local_38c,&local_418,&local_438,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&local_418);
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
        pSVar9 = &in_RDI->spxout;
        local_464[2] = SPxOut::getVerbosity(pSVar9);
        local_464[1] = 3;
        SPxOut::setVerbosity(pSVar9,local_464 + 1);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                           (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
        SPxOut::setVerbosity(&in_RDI->spxout,local_464 + 2);
      }
      (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
      local_1 = 0;
      goto LAB_007c9f39;
    }
    goto LAB_007c9625;
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffff940,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffff940,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffff940,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffff940,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  if ((local_32 & 1) == 0) {
    if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0xfffffffffffffff8) &&
       (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 0 < (int)VVar5)) {
      in_stack_fffffffffffff940 =
           (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)&in_RDI->spxout;
      local_464[0] = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffff940);
      local_468 = WARNING;
      SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffff940,&local_468);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff940,
                         (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      SPxOut::setVerbosity(&in_RDI->spxout,local_464);
    }
    in_RDI->_hasBasis = false;
  }
  (*in_RDI->_statistics->reconstructionTime->_vptr_Timer[4])();
  local_1 = local_31 & 1;
LAB_007c9f39:
  local_5c = 1;
  DIdxSet::~DIdxSet((DIdxSet *)in_stack_fffffffffffff940);
  return (bool)(local_1 & 1);
}

Assistant:

bool SoPlexBase<R>::_reconstructSolutionRational(SolRational& sol,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const Rational& denomBoundSquared)
{
   bool success;
   bool isSolBasic;
   DIdxSet basicIndices(numColsRational());

   success = false;
   isSolBasic = true;

   if(!sol.isPrimalFeasible() || !sol.isDualFeasible())
      return success;

   // start timing and increment statistics counter
   _statistics->reconstructionTime->start();
   _statistics->rationalReconstructions++;

   // reconstruct primal vector
   _workSol._primal = sol._primal;

   for(int j = 0; j < numColsRational(); ++j)
   {
      if(basisStatusCols[j] == SPxSolverBase<R>::BASIC)
         basicIndices.addIdx(j);
   }

   success = reconstructVector(_workSol._primal, denomBoundSquared, &basicIndices);

   if(!success)
   {
      SPX_MSG_INFO1(spxout, spxout << "Rational reconstruction of primal solution failed.\n");
      _statistics->reconstructionTime->stop();
      return success;
   }

   SPxOut::debug(this, "Rational reconstruction of primal solution successful.\n");

   // check violation of bounds
   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      // we want to notify the user whether the reconstructed solution is basic; otherwise, this would be redundant
      typename SPxSolverBase<R>::VarStatus& basisStatusCol = _basisStatusCols[c];

      if((basisStatusCol == SPxSolverBase<R>::FIXED && _workSol._primal[c] != lowerRational(c))
            || (basisStatusCol == SPxSolverBase<R>::ON_LOWER && _workSol._primal[c] != lowerRational(c))
            || (basisStatusCol == SPxSolverBase<R>::ON_UPPER && _workSol._primal[c] != upperRational(c))
            || (basisStatusCol == SPxSolverBase<R>::ZERO && _workSol._primal[c] != 0)
            || (basisStatusCol == SPxSolverBase<R>::UNDEFINED))
      {
         isSolBasic = false;
      }

      if(_lowerFinite(_colTypes[c]) && _workSol._primal[c] < lowerRational(c))
      {
         SPxOut::debug(this, "Lower bound of variable {} violated by {}\n",
                       c, (static_cast<Rational>(lowerRational(c) - _workSol._primal[c])).str());
         SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution primal infeasible (1).\n");
         _statistics->reconstructionTime->stop();
         return false;
      }

      if(_upperFinite(_colTypes[c]) && _workSol._primal[c] > upperRational(c))
      {
         SPxOut::debug(this, "Upper bound of variable {} violated by {}\n",
                       c, (static_cast<Rational>(_workSol._primal[c] - upperRational(c))).str());
         SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution primal infeasible (2).\n");
         _statistics->reconstructionTime->stop();
         return false;
      }
   }

   // compute slacks
   ///@todo we should compute them one by one so we can abort when encountering an infeasibility
   _workSol._slacks.reDim(numRowsRational());
   _rationalLP->computePrimalActivity(_workSol._primal, _workSol._slacks);

   // check violation of sides
   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      // we want to notify the user whether the reconstructed solution is basic; otherwise, this would be redundant
      typename SPxSolverBase<R>::VarStatus& basisStatusRow = _basisStatusRows[r];

      if((basisStatusRow == SPxSolverBase<R>::FIXED && _workSol._slacks[r] != lhsRational(r))
            || (basisStatusRow == SPxSolverBase<R>::ON_LOWER && _workSol._slacks[r] != lhsRational(r))
            || (basisStatusRow == SPxSolverBase<R>::ON_UPPER && _workSol._slacks[r] != rhsRational(r))
            || (basisStatusRow == SPxSolverBase<R>::ZERO && _workSol._slacks[r] != 0)
            || (basisStatusRow == SPxSolverBase<R>::UNDEFINED))
      {
         isSolBasic = false;
      }

      if(_lowerFinite(_rowTypes[r]) && _workSol._slacks[r] < lhsRational(r))
      {
         SPxOut::debug(this, "Lhs of row {} violated by {}\n",
                       r, (static_cast<Rational>(lhsRational(r) - _workSol._slacks[r])).str());
         SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution primal infeasible (3).\n");
         _statistics->reconstructionTime->stop();
         return false;
      }

      if(_upperFinite(_rowTypes[r]) && _workSol._slacks[r] > rhsRational(r))
      {
         SPxOut::debug(this, "Rhs of row {} violated by {}\n",
                       r, (static_cast<Rational>(_workSol._slacks[r] - rhsRational(r))).str());
         SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution primal infeasible (4).\n");
         _statistics->reconstructionTime->stop();
         return false;
      }
   }

   // reconstruct dual vector
   _workSol._dual = sol._dual;

   success = reconstructVector(_workSol._dual, denomBoundSquared);

   if(!success)
   {
      SPX_MSG_INFO1(spxout, spxout << "Rational reconstruction of dual solution failed.\n");
      _statistics->reconstructionTime->stop();
      return success;
   }

   SPxOut::debug(this, "Rational reconstruction of dual vector successful.\n");

   // check dual multipliers before reduced costs because this check is faster since it does not require the
   // computation of reduced costs
   const bool maximizing = (intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE);

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      int sig = sign(_workSol._dual[r]);

      if((!maximizing && sig > 0) || (maximizing && sig < 0))
      {
         if(!_lowerFinite(_rowTypes[r]) || _workSol._slacks[r] > lhsRational(r))
         {
            SPxOut::debug(this,
                          "complementary slackness violated by row {} with dual {} and slack {} not at lhs {}\n",
                          r, _workSol._dual[r].str(), _workSol._slacks[r].str(), lhsRational(r).str());
            SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution dual infeasible (1).\n");
            _statistics->reconstructionTime->stop();
            return false;
         }

         if(_basisStatusRows[r] != SPxSolverBase<R>::ON_LOWER
               && _basisStatusRows[r] != SPxSolverBase<R>::FIXED)
         {
            if(_basisStatusRows[r] == SPxSolverBase<R>::BASIC
                  || _basisStatusRows[r] == SPxSolverBase<R>::UNDEFINED)
               isSolBasic = false;
            else
               _basisStatusRows[r] = SPxSolverBase<R>::ON_LOWER;
         }
      }
      else if((!maximizing && sig < 0) || (maximizing && sig > 0))
      {
         if(!_upperFinite(_rowTypes[r]) || _workSol._slacks[r] < rhsRational(r))
         {
            SPxOut::debug(this,
                          "complementary slackness violated by row {} with dual {} and slack {} not at rhs {}\n",
                          r, _workSol._dual[r].str(), _workSol._slacks[r].str(), rhsRational(r).str());
            SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution dual infeasible (2).\n");
            _statistics->reconstructionTime->stop();
            return false;
         }

         if(_basisStatusRows[r] != SPxSolverBase<R>::ON_UPPER
               && _basisStatusRows[r] != SPxSolverBase<R>::FIXED)
         {
            if(_basisStatusRows[r] == SPxSolverBase<R>::BASIC
                  || _basisStatusRows[r] == SPxSolverBase<R>::UNDEFINED)
               isSolBasic = false;
            else
               _basisStatusRows[r] = SPxSolverBase<R>::ON_UPPER;
         }
      }
   }

   // compute reduced cost vector; we assume that the objective function vector has less nonzeros than the reduced
   // cost vector, and so multiplying with -1 first and subtracting the dual activity should be faster than adding
   // the dual activity and negating afterwards
   ///@todo we should compute them one by one so we can abort when encountering an infeasibility
   _workSol._redCost.reDim(numColsRational());
   _rationalLP->getObj(_workSol._redCost);
   _rationalLP->subDualActivity(_workSol._dual, _workSol._redCost);

   // check reduced cost violation
   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      int sig = sign(_workSol._redCost[c]);

      if((!maximizing && sig > 0) || (maximizing && sig < 0))
      {
         if(!_lowerFinite(_colTypes[c]) || _workSol._primal[c] > lowerRational(c))
         {
            SPxOut::debug(this,
                          "complementary slackness violated by column {} with reduced cost {} and value {} not at lower bound {}\n",
                          c, _workSol._redCost[c].str(), _workSol._primal[c].str(), lowerRational(c).str());
            SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution dual infeasible (3).\n");
            _statistics->reconstructionTime->stop();
            return false;
         }

         if(_basisStatusCols[c] != SPxSolverBase<R>::ON_LOWER
               && _basisStatusCols[c] != SPxSolverBase<R>::FIXED)
         {
            if(_basisStatusCols[c] == SPxSolverBase<R>::BASIC
                  || _basisStatusCols[c] == SPxSolverBase<R>::UNDEFINED)
               isSolBasic = false;
            else
               _basisStatusCols[c] = SPxSolverBase<R>::ON_LOWER;
         }
      }
      else if((!maximizing && sig < 0) || (maximizing && sig > 0))
      {
         if(!_upperFinite(_colTypes[c]) || _workSol._primal[c] < upperRational(c))
         {
            SPxOut::debug(this,
                          "complementary slackness violated by column {} with reduced cost {} and value {} not at upper bound {}\n",
                          c, _workSol._redCost[c].str(), _workSol._primal[c].str(), upperRational(c).str());
            SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution dual infeasible (4).\n");
            _statistics->reconstructionTime->stop();
            return false;
         }

         if(_basisStatusCols[c] != SPxSolverBase<R>::ON_UPPER
               && _basisStatusCols[c] != SPxSolverBase<R>::FIXED)
         {
            if(_basisStatusCols[c] == SPxSolverBase<R>::BASIC
                  || _basisStatusCols[c] == SPxSolverBase<R>::UNDEFINED)
               isSolBasic = false;
            else
               _basisStatusCols[c] = SPxSolverBase<R>::ON_UPPER;
         }
      }
   }

   // update solution
   sol._primal = _workSol._primal;
   sol._slacks = _workSol._slacks;
   sol._dual = _workSol._dual;
   sol._redCost = _workSol._redCost;

   if(!isSolBasic)
   {
      SPX_MSG_WARNING(spxout, spxout << "Warning: Reconstructed solution not basic.\n");
      _hasBasis = false;
   }

   // stop timing
   _statistics->reconstructionTime->stop();

   return success;
}